

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue.h
# Opt level: O1

void __thiscall
density::
heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>_>
::clean_dead_elements
          (heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>_>
           *this)

{
  ulong uVar1;
  ulong *i_page;
  bool bVar2;
  
  i_page = *(ulong **)(this + 0x28);
  bVar2 = i_page == *(ulong **)(this + 0x30);
  if (!bVar2) {
    uVar1 = *i_page;
    while (((uint)uVar1 & 3) == 2) {
      if ((uVar1 & 4) != 0) {
        density_tests::DeepTestAllocator<256UL>::deallocate
                  ((DeepTestAllocator<256UL> *)this,(void *)i_page[2],i_page[3],i_page[4],0);
      }
      if (0xff < (uVar1 ^ (ulong)i_page)) {
        density_tests::DeepTestAllocator<256UL>::deallocate_page
                  ((DeepTestAllocator<256UL> *)this,i_page);
      }
      i_page = (ulong *)(uVar1 & 0xfffffffffffffff8);
      bVar2 = *(ulong **)(this + 0x30) == i_page;
      if (bVar2) goto LAB_00c37730;
      uVar1 = *i_page;
    }
    if ((!bVar2) && ((*i_page & 3) == 2)) {
      density_tests::detail::assert_failed<>
                ("curr == m_tail || (curr->m_next & (detail::Queue_Busy | detail::Queue_Dead)) != detail::Queue_Dead"
                 ,
                 "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/heter_queue.h"
                 ,0xb88);
    }
  }
LAB_00c37730:
  *(ulong **)(this + 0x28) = i_page;
  return;
}

Assistant:

void clean_dead_elements() noexcept
        {
            auto curr = m_head;
            while (curr != m_tail)
            {
                // break if the current block is busy or is not dead
                if (
                  (curr->m_next & (detail::Queue_Busy | detail::Queue_Dead)) != detail::Queue_Dead)
                {
                    break;
                }

                auto next =
                  reinterpret_cast<ControlBlock *>(curr->m_next & ~detail::Queue_AllFlags);
                if (curr->m_next & detail::Queue_External)
                {
                    auto result = address_add(curr, s_sizeof_ControlBlock + s_sizeof_RuntimeType);
                    const auto & block = *static_cast<ExternalBlock *>(result);
                    ALLOCATOR_TYPE::deallocate(block.m_element, block.m_size, block.m_alignment);
                }

                if (!same_page(next, curr))
                {
                    allocator_type::deallocate_page(curr);
                }

                curr = next;
            }

            DENSITY_ASSERT_INTERNAL(
              curr == m_tail ||
              (curr->m_next & (detail::Queue_Busy | detail::Queue_Dead)) != detail::Queue_Dead);
            m_head = curr;
        }